

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launcher.cxx
# Opt level: O3

int __thiscall
nuraft::raft_launcher::init
          (raft_launcher *this,ptr<state_machine> *sm,ptr<state_mgr> *smgr,ptr<logger> *lg,
          int port_number,options *asio_options,raft_params *params_given,init_options *opt)

{
  ptr<rpc_listener> *listener;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  asio_service_impl *paVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  rpc_listener *__tmp;
  element_type *peVar7;
  context *this_00;
  undefined4 in_register_00000084;
  init_options *in_stack_00000018;
  undefined1 local_79;
  ptr<rpc_client_factory> rpc_cli_factory;
  ptr<delayed_task_scheduler> scheduler;
  asio_service_impl *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ptr<state_machine> *local_40;
  context *ctx;
  
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lg;
  local_40 = (ptr<state_machine> *)smgr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::asio_service,std::allocator<nuraft::asio_service>,nuraft::asio_service_options_const&,std::shared_ptr<nuraft::logger>&>
            (&scheduler.
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(asio_service **)&scheduler,
             (allocator<nuraft::asio_service> *)&rpc_cli_factory,
             (asio_service_options *)params_given,
             (shared_ptr<nuraft::logger> *)CONCAT44(in_register_00000084,port_number));
  _Var4 = scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  peVar7 = scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)peVar7;
  (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var4._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (scheduler.
               super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  asio_service::create_rpc_listener
            ((asio_service *)&scheduler,
             (ushort)(sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(ptr<logger> *)((ulong)asio_options & 0xffff));
  _Var4 = scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  peVar7 = scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  listener = (ptr<rpc_listener> *)(sm + 1);
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sm[1].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar7;
  p_Var1 = sm[1].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  sm[1].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (scheduler.
                 super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    peVar7 = (element_type *)
             (listener->super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
  }
  if (peVar7 == (element_type *)0x0) {
    (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_001f00fc;
  }
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((long)scheduler.
                    super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 8);
    if ((element_type *)
        scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               scheduler.
               super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
    }
    rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      peVar2 = (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(peVar2 + 8);
      if (peVar2 == (element_type *)0x0) {
        rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
      }
      rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_001f001f;
    }
    else {
      (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               ((long)scheduler.
                      super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 8);
      if ((element_type *)
          scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 scheduler.
                 super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      }
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (rpc_cli_factory.
            super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (rpc_cli_factory.
            super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
LAB_001f001f:
  this_00 = (context *)operator_new(0xb8);
  context::context(this_00,(ptr<state_mgr> *)local_48._M_pi,local_40,listener,
                   (shared_ptr<nuraft::logger> *)CONCAT44(in_register_00000084,port_number),
                   &rpc_cli_factory,&scheduler,(raft_params *)opt);
  ctx = this_00;
  std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nuraft::raft_server>,nuraft::context*&,nuraft::raft_server::init_options_const&>
            ((__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<nuraft::raft_server> *)&local_79,&ctx,in_stack_00000018);
  p_Var6 = p_Stack_50;
  paVar5 = local_58;
  local_58 = (asio_service_impl *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = sm[2].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  sm[2].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)paVar5;
  sm[2].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  peVar3 = (listener->super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar3->_vptr_rpc_listener[2])(peVar3,sm + 2);
  (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       sm[2].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = sm[2].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (rpc_cli_factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rpc_cli_factory.
               super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (scheduler.super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (scheduler.
               super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_001f00fc:
  return (int)this;
}

Assistant:

ptr<raft_server> raft_launcher::init(ptr<state_machine> sm,
                                     ptr<state_mgr> smgr,
                                     ptr<logger> lg,
                                     int port_number,
                                     const asio_service::options& asio_options,
                                     const raft_params& params_given,
                                     const raft_server::init_options& opt)
{
    asio_svc_ = cs_new<asio_service>(asio_options, lg);
    asio_listener_ = asio_svc_->create_rpc_listener(port_number, lg);
    if (!asio_listener_) return nullptr;

    ptr<delayed_task_scheduler> scheduler = asio_svc_;
    ptr<rpc_client_factory> rpc_cli_factory = asio_svc_;

    context* ctx = new context( smgr,
                                sm,
                                asio_listener_,
                                lg,
                                rpc_cli_factory,
                                scheduler,
                                params_given );
    raft_instance_ = cs_new<raft_server>(ctx, opt);
    asio_listener_->listen( raft_instance_ );
    return raft_instance_;
}